

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

container_t *
container_inot_range
          (container_t *c,uint8_t type,uint32_t range_start,uint32_t range_end,uint8_t *result_type)

{
  undefined1 uVar1;
  _Bool _Var2;
  int iVar3;
  container_t *local_38;
  container_t *result;
  uint8_t *result_type_local;
  uint32_t local_20;
  uint32_t range_end_local;
  uint32_t range_start_local;
  uint8_t type_local;
  container_t *c_local;
  
  result = result_type;
  result_type_local._4_4_ = range_end;
  local_20 = range_start;
  range_end_local._3_1_ = type;
  _range_start_local = (array_container_t *)c;
  _range_start_local =
       (array_container_t *)get_writable_copy_if_shared(c,(uint8_t *)((long)&range_end_local + 3));
  local_38 = (container_t *)0x0;
  if (range_end_local._3_1_ == '\x01') {
    _Var2 = bitset_container_negation_range_inplace
                      ((bitset_container_t *)_range_start_local,local_20,result_type_local._4_4_,
                       &local_38);
    uVar1 = 2;
    if (_Var2) {
      uVar1 = 1;
    }
    *(undefined1 *)result = uVar1;
    c_local = local_38;
  }
  else if (range_end_local._3_1_ == '\x02') {
    _Var2 = array_container_negation_range_inplace
                      (_range_start_local,local_20,result_type_local._4_4_,&local_38);
    uVar1 = 2;
    if (_Var2) {
      uVar1 = 1;
    }
    *(undefined1 *)result = uVar1;
    c_local = local_38;
  }
  else {
    if (range_end_local._3_1_ != '\x03') {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x188f,
                    "container_t *container_inot_range(container_t *, uint8_t, uint32_t, uint32_t, uint8_t *)"
                   );
    }
    iVar3 = run_container_negation_range_inplace
                      ((run_container_t *)_range_start_local,local_20,result_type_local._4_4_,
                       &local_38);
    *(char *)result = (char)iVar3;
    c_local = local_38;
  }
  return c_local;
}

Assistant:

static inline container_t *container_inot_range(
    container_t *c, uint8_t type,
    uint32_t range_start, uint32_t range_end,
    uint8_t *result_type
){
    c = get_writable_copy_if_shared(c, &type);
    container_t *result = NULL;
    switch (type) {
        case BITSET_CONTAINER_TYPE:
            *result_type =
                bitset_container_negation_range_inplace(
                    CAST_bitset(c), range_start, range_end, &result)
                        ? BITSET_CONTAINER_TYPE
                        : ARRAY_CONTAINER_TYPE;
            return result;
        case ARRAY_CONTAINER_TYPE:
            *result_type =
                array_container_negation_range_inplace(
                    CAST_array(c), range_start, range_end, &result)
                        ? BITSET_CONTAINER_TYPE
                        : ARRAY_CONTAINER_TYPE;
            return result;
        case RUN_CONTAINER_TYPE:
            *result_type = run_container_negation_range_inplace(
                                CAST_run(c), range_start, range_end, &result);
            return result;

        default:
            assert(false);
            __builtin_unreachable();
    }
    assert(false);
    __builtin_unreachable();
    return NULL;
}